

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void P_BloodSplatter(DVector3 *pos,AActor *originator,DAngle *hitangle)

{
  uint uVar1;
  int iVar2;
  uint32 uVar3;
  DWORD DVar4;
  AActor *pAVar5;
  bool bVar6;
  TAngle<double> local_50;
  TFlags<ActorFlag2,_unsigned_int> local_44;
  AActor *local_40;
  AActor *mo;
  PClassActor *pPStack_30;
  int bloodtype;
  PClassActor *bloodcls;
  DAngle *pDStack_20;
  PalEntry bloodcolor;
  DAngle *hitangle_local;
  AActor *originator_local;
  DVector3 *pos_local;
  
  pDStack_20 = hitangle;
  bloodcls._4_4_ =
       (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
       AActor::GetBloodColor(originator);
  pPStack_30 = AActor::GetBloodType(originator,1);
  mo._4_4_ = FIntCVar::operator_cast_to_int(&cl_bloodtype);
  bVar6 = false;
  if (pPStack_30 != (PClassActor *)0x0) {
    pAVar5 = GetDefaultByType(&pPStack_30->super_PClass);
    TFlags<ActorFlag4,_unsigned_int>::operator&
              ((TFlags<ActorFlag4,_unsigned_int> *)&mo,
               (int)pAVar5 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&mo);
    bVar6 = uVar1 == 0;
  }
  if (bVar6) {
    mo._4_4_ = 0;
  }
  if (pPStack_30 != (PClassActor *)0x0) {
    local_40 = Spawn(pPStack_30,pos,NO_REPLACE);
    TObjPtr<AActor>::operator=(&local_40->target,originator);
    iVar2 = FRandom::Random2(&pr_splatter);
    (local_40->Vel).X = (double)iVar2 / 64.0;
    iVar2 = FRandom::Random2(&pr_splatter);
    (local_40->Vel).Y = (double)iVar2 / 64.0;
    (local_40->Vel).Z = 3.0;
    uVar3 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)((long)&bloodcls + 4));
    bVar6 = false;
    if (uVar3 != 0) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_44,(int)local_40 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
      uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
      bVar6 = uVar1 == 0;
    }
    if (bVar6) {
      DVar4 = TRANSLATION('\b',bloodcls._4_4_ >> 0x18);
      local_40->Translation = DVar4;
    }
    if (1 < mo._4_4_) {
      TFlags<ActorRenderFlag,_unsigned_int>::operator|=(&local_40->renderflags,RF_INVISIBLE);
    }
  }
  if (0 < mo._4_4_) {
    TAngle<double>::operator-(&local_50,180.0);
    uVar3 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)((long)&bloodcls + 4));
    P_DrawSplash2(0x28,pos,&local_50,2,uVar3);
  }
  return;
}

Assistant:

void P_BloodSplatter (const DVector3 &pos, AActor *originator, DAngle hitangle)
{
	PalEntry bloodcolor = originator->GetBloodColor();
	PClassActor *bloodcls = originator->GetBloodType(1); 

	int bloodtype = cl_bloodtype;
	
	if (bloodcls != NULL && !(GetDefaultByType(bloodcls)->flags4 & MF4_ALLOWPARTICLES))
		bloodtype = 0;

	if (bloodcls != NULL)
	{
		AActor *mo;

		mo = Spawn(bloodcls, pos, NO_REPLACE); // GetBloodType already performed the replacement
		mo->target = originator;
		mo->Vel.X = pr_splatter.Random2 () / 64.;
		mo->Vel.Y = pr_splatter.Random2() / 64.;
		mo->Vel.Z = 3;

		// colorize the blood!
		if (bloodcolor!=0 && !(mo->flags2 & MF2_DONTTRANSLATE)) 
		{
			mo->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
		}

		if (!(bloodtype <= 1)) mo->renderflags |= RF_INVISIBLE;
	}
	if (bloodtype >= 1)
	{
		P_DrawSplash2 (40, pos, hitangle-180., 2, bloodcolor);
	}
}